

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>_>
* __thiscall
kj::_::
ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>_>
::operator=(ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>_>
            *this,ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>_>
                  *param_1)

{
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>_>
  *param_1_local;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>_>
  *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>_>::
  operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;